

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v11::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  numpunct *pnVar1;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__format_facet_00244c10;
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  (this->separator_)._M_string_length = 0;
  (this->separator_).field_2._M_local_buf[0] = '\0';
  (this->grouping_)._M_dataplus._M_p = (pointer)&(this->grouping_).field_2;
  (this->grouping_)._M_string_length = 0;
  (this->grouping_).field_2._M_local_buf[0] = '\0';
  (this->decimal_point_)._M_dataplus._M_p = (pointer)&(this->decimal_point_).field_2;
  (this->decimal_point_)._M_string_length = 0;
  (this->decimal_point_).field_2._M_local_buf[0] = '\0';
  pnVar1 = std::use_facet<std::__cxx11::numpunct<char>>(loc);
  (**(code **)(*(long *)pnVar1 + 0x20))(local_48,pnVar1);
  std::__cxx11::string::operator=((string *)&this->grouping_,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if ((this->grouping_)._M_string_length != 0) {
    (**(code **)(*(long *)pnVar1 + 0x18))(pnVar1);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
    std::__cxx11::string::operator=((string *)&this->separator_,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& np = detail::use_facet<detail::numpunct<char>>(loc);
  grouping_ = np.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, np.thousands_sep());
}